

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_PeginSequence_Test::TestBody
          (ConfidentialTransactionContext_PeginSequence_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  AssertionResult gtest_ar;
  CfdException *except;
  OutPoint outpoint1;
  Privkey key;
  ConfidentialTransactionContext txc;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  UtxoData utxo1;
  Transaction btc_tx;
  ElementsAddressFactory factory;
  string *in_stack_fffffffffffff178;
  UtxoData *in_stack_fffffffffffff180;
  allocator *paVar2;
  allocator_type *in_stack_fffffffffffff1a8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_fffffffffffff1b0;
  undefined4 in_stack_fffffffffffff1b8;
  NetType in_stack_fffffffffffff1bc;
  ElementsAddressFactory *in_stack_fffffffffffff1c0;
  ConfidentialAssetId *asset;
  allocator *paVar3;
  UtxoData *in_stack_fffffffffffff1e0;
  UtxoData *in_stack_fffffffffffff1e8;
  UtxoData *in_stack_fffffffffffff1f0;
  ConfidentialTransactionContext *this_00;
  ConfidentialTransactionContext *local_e08;
  SigHashType local_dc0;
  allocator local_db1;
  string local_db0;
  Privkey local_d90;
  allocator local_d69;
  string local_d68;
  Pubkey local_d48;
  OutPoint local_d30;
  AssertHelper local_d08;
  Message local_d00 [2];
  Pubkey local_cf0;
  ConfidentialNonce local_cd8;
  allocator local_ca9;
  string local_ca8;
  Script local_c88;
  Amount local_c50;
  Privkey local_c40;
  allocator local_c19;
  string local_c18 [32];
  ConfidentialTransaction local_bf8 [3];
  ConfidentialTransactionContext *local_b38;
  ConfidentialTransactionContext local_b30 [3];
  OutPoint *in_stack_fffffffffffff718;
  ConfidentialTransactionContext *in_stack_fffffffffffff720;
  undefined1 in_stack_fffffffffffff72f;
  SigHashType *in_stack_fffffffffffff730;
  Privkey *in_stack_fffffffffffff738;
  Pubkey *in_stack_fffffffffffff740;
  OutPoint *in_stack_fffffffffffff748;
  ConfidentialTransactionContext *in_stack_fffffffffffff750;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_fffffffffffff828;
  ConfidentialTransactionContext *in_stack_fffffffffffff830;
  undefined1 local_640 [48];
  string local_610;
  ConfidentialAssetId local_5f0;
  Amount local_5c8;
  Txid local_5b8;
  pointer local_598;
  Txid local_570;
  uint32_t local_550;
  string local_360 [32];
  _Base_ptr local_340;
  undefined1 local_338;
  ConfidentialAssetId local_320 [16];
  allocator local_91;
  string local_90;
  Transaction local_70;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1bc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,
             "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad800000000"
             ,&local_91);
  cfd::core::Transaction::Transaction(&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  cfd::UtxoData::UtxoData(in_stack_fffffffffffff1e0);
  local_598 = (pointer)0x0;
  cfd::core::AbstractTransaction::GetTxid(&local_5b8,&local_70.super_AbstractTransaction);
  cfd::core::Txid::operator=(&local_570,&local_5b8);
  cfd::core::Txid::~Txid((Txid *)0x22c76b);
  local_550 = 0;
  std::__cxx11::string::operator=
            (local_360,"wpkh(02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3)");
  cfd::core::Amount::Amount(&local_5c8,0x5f5df0c);
  local_338 = local_5c8.ignore_check_;
  local_340 = (_Base_ptr)local_5c8.amount_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_610,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,(allocator *)(local_640 + 0x2f));
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_5f0,&local_610);
  cfd::core::ConfidentialAssetId::operator=(local_320,&local_5f0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x22c82c);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator((allocator<char> *)(local_640 + 0x2f));
  local_b38 = local_b30;
  cfd::UtxoData::UtxoData(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
  local_640._0_8_ = local_b30;
  local_640._8_8_ = (void *)0x1;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x22c896);
  __l._M_array._4_4_ = in_stack_fffffffffffff1bc;
  __l._M_array._0_4_ = in_stack_fffffffffffff1b8;
  __l._M_len = (size_type)in_stack_fffffffffffff1c0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_fffffffffffff1b0,__l,in_stack_fffffffffffff1a8);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x22c8ca);
  this_00 = local_b30;
  local_e08 = (ConfidentialTransactionContext *)local_640;
  do {
    local_e08 = (ConfidentialTransactionContext *)
                &local_e08[-7].super_ConfidentialTransaction.vin_.
                 super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    cfd::UtxoData::~UtxoData(in_stack_fffffffffffff180);
  } while (local_e08 != this_00);
  paVar2 = &local_c19;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c18,
             "0200000001017b9c531679cc8b8310338e350dbfd89bbfaf19fd227e3d1a69f8baf0088570120000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5db2402fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014e794713e386d83f32baa0e9d03e47c0839dc57a8c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad8000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000"
             ,paVar2);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff180,in_stack_fffffffffffff178);
  std::__cxx11::string::~string(local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_c19);
  cfd::core::Privkey::GenerageRandomKey();
  cfd::core::Amount::Amount(&local_c50,0);
  asset = local_320;
  paVar3 = &local_ca9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ca8,"6a",paVar3);
  cfd::core::Script::Script(&local_c88,&local_ca8);
  cfd::core::Privkey::GetPubkey(&local_cf0,&local_c40);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_cd8,&local_cf0);
  cfd::core::ConfidentialTransaction::AddTxOut(local_bf8,&local_c50,asset,&local_c88,&local_cd8);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x22ca4b);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x22ca58);
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffff180);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                (in_stack_fffffffffffff830,in_stack_fffffffffffff828);
    }
  }
  else {
    testing::Message::Message(local_d00);
    testing::internal::AssertHelper::AssertHelper
              (&local_d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x3ec,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_d08,local_d00);
    testing::internal::AssertHelper::~AssertHelper(&local_d08);
    testing::Message::~Message((Message *)0x22ce75);
  }
  cfd::ConfidentialTransactionContext::Blind
            (this_00,(vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                      *)local_e08,(int64_t)paVar2,(int)((ulong)paVar3 >> 0x20),(int)paVar3,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)asset);
  cfd::core::OutPoint::OutPoint(&local_d30,&local_570,local_550);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d68,
             "02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3",&local_d69);
  cfd::core::Pubkey::Pubkey(&local_d48,&local_d68);
  paVar2 = &local_db1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_db0,"cUfipPioYnHU61pfYTH9uuNoswRXx8rtzXhJZrsPeVV1LRFdTxvp",paVar2);
  cfd::core::Privkey::FromWif(&local_d90,&local_db0,kTestnet,true);
  cfd::core::SigHashType::SigHashType(&local_dc0);
  cfd::ConfidentialTransactionContext::SignWithKey
            (in_stack_fffffffffffff750,in_stack_fffffffffffff748,in_stack_fffffffffffff740,
             in_stack_fffffffffffff738,in_stack_fffffffffffff730,(bool)in_stack_fffffffffffff72f);
  cfd::core::Privkey::~Privkey((Privkey *)0x22cfe0);
  std::__cxx11::string::~string((string *)&local_db0);
  std::allocator<char>::~allocator((allocator<char> *)&local_db1);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x22d007);
  std::__cxx11::string::~string((string *)&local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  cfd::ConfidentialTransactionContext::Verify(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x22d2a9);
  cfd::core::Privkey::~Privkey((Privkey *)0x22d2b6);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff180);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)paVar2);
  cfd::UtxoData::~UtxoData(in_stack_fffffffffffff180);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff180);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x22d2f7);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, PeginSequence)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);

  Transaction btc_tx("020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad800000000");

  // Address1 (p2wpkh)
  // pubkey: '02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3',
  // privkey: 'cUfipPioYnHU61pfYTH9uuNoswRXx8rtzXhJZrsPeVV1LRFdTxvp'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.txid = btc_tx.GetTxid();
  utxo1.vout = 0;
  utxo1.descriptor = "wpkh(02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3)";
  utxo1.amount = Amount(int64_t{99999500});
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.locking_script = Script("0014e794713e386d83f32baa0e9d03e47c0839dc57a8");
  // utxo1.redeem_script;
  // utxo1.address = factory.GetAddress("ert1qu728z03cdkplx2a2p6ws8erupquac4ag9xjpx6");
  // utxo1.address_type = AddressType::kP2wpkhAddress;

  std::vector<cfd::UtxoData> utxos{utxo1};
  ConfidentialTransactionContext txc("0200000001017b9c531679cc8b8310338e350dbfd89bbfaf19fd227e3d1a69f8baf0088570120000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5db2402fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014e794713e386d83f32baa0e9d03e47c0839dc57a8c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a91426b9ba9cf5d822b70cf490ad0394566f9db20c63870247304402200b3ca71e82551a333fe5c8ce9a8f8454eb8f08aa194180e5a87c79ccf2e46212022065c1f2a363ebcb155a80e234258394140d08f6ab807581953bb21a58f2d229a6012102fd54c734e48c544c3c3ad1aab0607f896eb95e23e7058b174a580826a7940ad8000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000");

  auto key = Privkey::GenerageRandomKey();
  txc.AddTxOut(Amount(0), utxo1.asset, Script("6a"), ConfidentialNonce(key.GetPubkey()));

  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));
  txc.Blind();

  // sign1
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  try {
    txc.SignWithKey(outpoint1,
      Pubkey("02e053cd67c379c3f1a2c4dfcf8e11495510f59d1da814a4172d205088ab7ee5d3"),
      Privkey::FromWif(
          "cUfipPioYnHU61pfYTH9uuNoswRXx8rtzXhJZrsPeVV1LRFdTxvp", NetType::kTestnet));

    txc.Verify(outpoint1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}